

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall App::drawScores(App *this,Graphics *g)

{
  Graphics *pGVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  string local_258 [32];
  int local_238;
  char local_231;
  stringstream local_230 [8];
  stringstream ss;
  undefined1 local_220 [376];
  __cxx11 local_a8 [32];
  string local_88 [48];
  __cxx11 local_58 [32];
  string local_38 [32];
  Graphics *local_18;
  Graphics *g_local;
  App *this_local;
  
  local_18 = g;
  g_local = (Graphics *)this;
  piksel::Graphics::push(g);
  pvVar3 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&(this->spritesheet).sprites,0x27);
  piksel::Sprite::draw(pvVar3,local_18,0.0,0.0,32.0,32.0,false,false,false);
  pvVar3 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&(this->spritesheet).sprites,0x28);
  piksel::Sprite::draw
            (pvVar3,local_18,(float)((this->super_BaseApp).width + -0x50),0.0,32.0,32.0,false,false,
             false);
  piksel::Graphics::textSize(local_18,16.0);
  pGVar1 = local_18;
  iVar2 = Character::getLives(&this->character);
  std::__cxx11::to_string(local_58,iVar2);
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"x0");
  piksel::Graphics::text(pGVar1,local_38,32.0,24.0);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  pGVar1 = local_18;
  iVar2 = Ball::getLives(&this->ball);
  std::__cxx11::to_string(local_a8,iVar2);
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"x0");
  piksel::Graphics::text(pGVar1,local_88,(float)((this->super_BaseApp).width + -0x2f),24.0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::stringstream::stringstream(local_230);
  local_231 = (char)std::setfill<char>('0');
  poVar4 = std::operator<<(local_220,local_231);
  local_238 = (int)std::setw(6);
  poVar4 = std::operator<<(poVar4,(_Setw)local_238);
  iVar2 = Ball::getScore(&this->ball);
  std::ostream::operator<<(poVar4,iVar2);
  pGVar1 = local_18;
  std::__cxx11::stringstream::str();
  piksel::Graphics::text(pGVar1,local_258,(float)((this->super_BaseApp).width / 2 + -0x27),24.0);
  std::__cxx11::string::~string((string *)local_258);
  piksel::Graphics::pop(local_18);
  std::__cxx11::stringstream::~stringstream(local_230);
  return;
}

Assistant:

void App::drawScores(piksel::Graphics& g) {
    g.push();
    spritesheet.sprites[39].draw(g, 0, 0, 32, 32);
    spritesheet.sprites[40].draw(g, width - 80, 0, 32, 32);
    g.textSize(16);
    g.text("x0" + std::to_string(character.getLives()), 32, 24);
    g.text("x0" + std::to_string(ball.getLives()), width - 47, 24);
    std::stringstream ss;
    ss << std::setfill('0') << std::setw(6) << ball.getScore();
    g.text(ss.str(), width / 2 - 39, 24);
    g.pop();
}